

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# h264d_dpb.c
# Opt level: O0

void mm_unmark_short_term_for_reference
               (H264_DpbBuf_t *p_Dpb,H264_StorePic_t *p,RK_S32 difference_of_pic_nums_minus1)

{
  RK_S32 RVar1;
  uint local_24;
  RK_U32 i;
  RK_S32 picNumX;
  RK_S32 difference_of_pic_nums_minus1_local;
  H264_StorePic_t *p_local;
  H264_DpbBuf_t *p_Dpb_local;
  
  RVar1 = get_pic_num_x(p,difference_of_pic_nums_minus1);
  local_24 = 0;
  do {
    if (p_Dpb->ref_frames_in_buffer <= local_24) {
      return;
    }
    if (p->structure == 3) {
      if (((p_Dpb->fs_ref[local_24]->is_reference == 3) &&
          (p_Dpb->fs_ref[local_24]->is_long_term == 0)) &&
         (p_Dpb->fs_ref[local_24]->frame->pic_num == RVar1)) {
        unmark_for_reference(p_Dpb->p_Vid->p_Dec,p_Dpb->fs_ref[local_24]);
        return;
      }
    }
    else {
      if ((((p_Dpb->fs_ref[local_24]->is_reference & 1U) != 0) &&
          ((p_Dpb->fs_ref[local_24]->is_long_term & 1U) == 0)) &&
         (p_Dpb->fs_ref[local_24]->top_field->pic_num == RVar1)) {
        p_Dpb->fs_ref[local_24]->top_field->used_for_reference = 0;
        p_Dpb->fs_ref[local_24]->is_reference = p_Dpb->fs_ref[local_24]->is_reference & 2;
        if (p_Dpb->fs_ref[local_24]->is_used != 3) {
          return;
        }
        p_Dpb->fs_ref[local_24]->frame->used_for_reference = 0;
        return;
      }
      if ((((p_Dpb->fs_ref[local_24]->is_reference & 2U) != 0) &&
          ((p_Dpb->fs_ref[local_24]->is_long_term & 2U) == 0)) &&
         (p_Dpb->fs_ref[local_24]->bottom_field->pic_num == RVar1)) {
        p_Dpb->fs_ref[local_24]->bottom_field->used_for_reference = 0;
        p_Dpb->fs_ref[local_24]->is_reference = p_Dpb->fs_ref[local_24]->is_reference & 1;
        if (p_Dpb->fs_ref[local_24]->is_used != 3) {
          return;
        }
        p_Dpb->fs_ref[local_24]->frame->used_for_reference = 0;
        return;
      }
    }
    local_24 = local_24 + 1;
  } while( true );
}

Assistant:

static void mm_unmark_short_term_for_reference(H264_DpbBuf_t *p_Dpb, H264_StorePic_t *p, RK_S32 difference_of_pic_nums_minus1)
{
    RK_S32 picNumX = 0;
    RK_U32 i = 0;

    picNumX = get_pic_num_x(p, difference_of_pic_nums_minus1);

    for (i = 0; i < p_Dpb->ref_frames_in_buffer; i++) {
        if (p->structure == FRAME) {
            if ((p_Dpb->fs_ref[i]->is_reference == 3) && (p_Dpb->fs_ref[i]->is_long_term == 0)) {
                if (p_Dpb->fs_ref[i]->frame->pic_num == picNumX) {
                    unmark_for_reference(p_Dpb->p_Vid->p_Dec, p_Dpb->fs_ref[i]);
                    return;
                }
            }
        } else {
            if ((p_Dpb->fs_ref[i]->is_reference & 1) && (!(p_Dpb->fs_ref[i]->is_long_term & 1))) {
                if (p_Dpb->fs_ref[i]->top_field->pic_num == picNumX) {
                    p_Dpb->fs_ref[i]->top_field->used_for_reference = 0;
                    p_Dpb->fs_ref[i]->is_reference &= 2;
                    if (p_Dpb->fs_ref[i]->is_used == 3) {
                        p_Dpb->fs_ref[i]->frame->used_for_reference = 0;
                    }
                    return;
                }
            }
            if ((p_Dpb->fs_ref[i]->is_reference & 2) && (!(p_Dpb->fs_ref[i]->is_long_term & 2))) {
                if (p_Dpb->fs_ref[i]->bottom_field->pic_num == picNumX) {
                    p_Dpb->fs_ref[i]->bottom_field->used_for_reference = 0;
                    p_Dpb->fs_ref[i]->is_reference &= 1;
                    if (p_Dpb->fs_ref[i]->is_used == 3) {
                        p_Dpb->fs_ref[i]->frame->used_for_reference = 0;
                    }
                    return;
                }
            }
        }
    }
}